

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

bool mjs::to_boolean(value *v)

{
  bool bVar1;
  value_type vVar2;
  int iVar3;
  string *this;
  wostream *os;
  double dVar4;
  byte local_1e9;
  wstring local_1e0 [32];
  wstring_view local_1c0 [2];
  wostringstream local_1a0 [8];
  wostringstream _woss;
  wstring_view local_28;
  value *local_18;
  value *v_local;
  
  local_18 = v;
  vVar2 = value::type(v);
  switch(vVar2) {
  case undefined:
    v_local._7_1_ = false;
    break;
  case null:
    v_local._7_1_ = false;
    break;
  case boolean:
    v_local._7_1_ = value::boolean_value(local_18);
    break;
  case number:
    dVar4 = value::number_value(local_18);
    local_1e9 = 0;
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      dVar4 = value::number_value(local_18);
      iVar3 = std::isnan(dVar4);
      local_1e9 = (byte)iVar3 ^ 0xff;
    }
    v_local._7_1_ = (bool)(local_1e9 & 1);
    break;
  case string:
    this = value::string_value(local_18);
    local_28 = string::view(this);
    bVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::empty(&local_28);
    v_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
    break;
  case object:
    v_local._7_1_ = true;
    break;
  case reference:
  default:
    std::__cxx11::wostringstream::wostringstream(local_1a0);
    os = std::operator<<((wostream *)local_1a0,"Not implemented: ");
    vVar2 = value::type(local_18);
    operator<<(os,vVar2);
    std::__cxx11::wostringstream::str();
    local_1c0[0] = (wstring_view)
                   std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1e0);
    throw_runtime_error(local_1c0,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                        ,0x97);
  }
  return v_local._7_1_;
}

Assistant:

bool to_boolean(const value& v) {
    switch (v.type()) {
    case value_type::undefined: return false;
    case value_type::null:      return false;
    case value_type::boolean:   return v.boolean_value();
    case value_type::number:    return v.number_value() != 0 && !std::isnan(v.number_value());
    case value_type::string:    return !v.string_value().view().empty();
    case value_type::object:    return true;
    case value_type::reference: break;
    }
    NOT_IMPLEMENTED(v.type());
}